

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void analogies(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  int iVar1;
  pointer pbVar2;
  element_type *__nptr;
  pointer pcVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  FastText fasttext;
  string local_e0;
  FastText local_c0;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
  if (lVar6 != 3) {
    if (lVar6 != 4) {
      printAnalogiesUsage();
      exit(1);
    }
    __nptr = (element_type *)pbVar2[3]._M_dataplus._M_p;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)__nptr,(char **)&local_c0,10);
    if (local_c0.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        __nptr) {
      iVar4 = *piVar5;
      if ((int)lVar6 != lVar6 || iVar4 == 0x22) {
        iVar4 = std::__throw_out_of_range("stoi");
      }
      if (iVar4 == 0) {
        *piVar5 = iVar1;
      }
      goto LAB_001225df;
    }
    std::__throw_invalid_argument("stoi");
  }
  lVar6 = 10;
LAB_001225df:
  ::fasttext::FastText::FastText(&local_c0);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  ::fasttext::FastText::loadModel(&local_c0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  ::fasttext::FastText::analogies(&local_c0,(int32_t)lVar6);
  exit(0);
}

Assistant:

void analogies(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printAnalogiesUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  fasttext.analogies(k);
  exit(0);
}